

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::String::EndsWithCaseInsensitive(string *str,string *suffix)

{
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  char *rhs;
  bool local_29;
  size_t suffix_len;
  size_t str_len;
  string *suffix_local;
  string *str_local;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (str);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (suffix);
  local_29 = false;
  if (sVar2 <= sVar1) {
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (str);
    rhs = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    (suffix);
    local_29 = CaseInsensitiveCStringEquals(pcVar3 + (sVar1 - sVar2),rhs);
  }
  return local_29;
}

Assistant:

bool String::EndsWithCaseInsensitive(const std::string& str,
                                     const std::string& suffix) {
  const size_t str_len = str.length();
  const size_t suffix_len = suffix.length();
  return (str_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(str.c_str() + str_len - suffix_len,
                                      suffix.c_str());
}